

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

Matrix<float,_2,_4> * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::outerProduct<float,4,2>
          (Matrix<float,_2,_4> *__return_storage_ptr__,MatrixCaseUtils *this,Vector<float,_2> *a,
          Vector<float,_4> *b)

{
  float fVar1;
  Matrix<float,_2,_4> *pMVar2;
  float *pfVar3;
  int r;
  long lVar4;
  int row;
  long lVar5;
  long lVar6;
  bool bVar7;
  undefined4 uVar8;
  Matrix<float,_4,_2> retVal;
  
  pMVar2 = __return_storage_ptr__;
  pfVar3 = (float *)&retVal;
  retVal.m_data.m_data[1].m_data[0] = 0.0;
  retVal.m_data.m_data[1].m_data[1] = 0.0;
  retVal.m_data.m_data[1].m_data[2] = 0.0;
  retVal.m_data.m_data[1].m_data[3] = 0.0;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  retVal.m_data.m_data[0].m_data[2] = 0.0;
  retVal.m_data.m_data[0].m_data[3] = 0.0;
  lVar4 = 0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      uVar8 = 0x3f800000;
      if (lVar4 != lVar6) {
        uVar8 = 0;
      }
      *(undefined4 *)((long)pfVar3 + lVar6) = uVar8;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 == 0x10);
    lVar5 = lVar5 + 1;
    pfVar3 = pfVar3 + 1;
    lVar4 = lVar4 + 0x10;
  } while (lVar5 != 4);
  pfVar3 = (float *)&retVal;
  lVar4 = 0;
  do {
    fVar1 = a->m_data[lVar4];
    lVar5 = 0;
    do {
      pfVar3[lVar5] = *(float *)(this + lVar5) * fVar1;
      lVar5 = lVar5 + 4;
    } while (lVar5 == 4);
    lVar4 = lVar4 + 1;
    pfVar3 = pfVar3 + 1;
  } while (lVar4 != 4);
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[2].m_data = 0;
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[3].m_data = 0;
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[0].m_data = 0;
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[1].m_data = 0;
  lVar4 = 0;
  pfVar3 = (float *)__return_storage_ptr__;
  do {
    lVar5 = 0;
    do {
      uVar8 = 0x3f800000;
      if (lVar4 != lVar5) {
        uVar8 = 0;
      }
      pfVar3[lVar5 * 2] = (float)uVar8;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    pfVar3 = pfVar3 + 1;
    bVar7 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar7);
  pfVar3 = (float *)&retVal;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      *(float *)((long)((Vector<tcu::Vector<float,_2>,_4> *)
                       ((Vector<float,_2> *)__return_storage_ptr__)->m_data)->m_data[0].m_data +
                lVar5) = pfVar3[lVar5];
      lVar5 = lVar5 + 4;
    } while (lVar5 == 4);
    lVar4 = lVar4 + 1;
    __return_storage_ptr__ = (Matrix<float,_2,_4> *)((long)__return_storage_ptr__ + 8);
    pfVar3 = pfVar3 + 1;
  } while (lVar4 != 4);
  return pMVar2;
}

Assistant:

tcu::Matrix<T, Cols, Rows> outerProduct (const tcu::Vector<T, Cols>& a, const tcu::Vector<T, Rows>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a[c] * b[r];

	return transpose(retVal); // to gl-form (column-major)
}